

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O0

void __thiscall
(anonymous_namespace)::DepGraphFormatter::Unser<SpanReader,bitset_detail::IntBitSet<unsigned_int>>
          (DepGraphFormatter *this,SpanReader *s,
          DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *depgraph)

{
  Span<const_unsigned_int> mapping;
  bool bVar1;
  uint uVar2;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> this_00;
  size_type sVar3;
  reference puVar4;
  size_type sVar5;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *in_RSI;
  long in_FS_OFFSET;
  failure *anon_var_0;
  uint *pos;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  ClusterIndex insert_distance;
  ClusterIndex dep_topo_idx;
  ClusterIndex dep_dist;
  ClusterIndex topo_idx;
  int64_t fee;
  iterator __end4;
  iterator __begin4;
  uint64_t diff;
  uint64_t coded_fee;
  int32_t size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reordering;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> topo_depgraph;
  undefined4 in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *in_stack_fffffffffffffe60;
  FeeFrac *in_stack_fffffffffffffe68;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> in_stack_fffffffffffffe80;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *in_stack_fffffffffffffe88;
  undefined1 *puVar6;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *pDVar7;
  uint in_stack_ffffffffffffff00;
  ClusterIndex in_stack_ffffffffffffff04;
  size_t in_stack_ffffffffffffff08;
  ulong local_78;
  uint local_4c;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> local_48 [2];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  while( true ) {
    pDVar7 = in_RSI;
    this_00 = Using<VarIntFormatter<(VarIntMode)1>,int&>((int *)in_stack_fffffffffffffe60);
    SpanReader::operator>>
              ((SpanReader *)in_stack_fffffffffffffe68,
               (Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)in_stack_fffffffffffffe60);
    local_4c = local_4c & 0x3fffff;
    if (local_4c == 0) break;
    sVar3 = cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::TxCount
                      ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    uVar2 = bitset_detail::IntBitSet<unsigned_int>::Size();
    if (sVar3 == uVar2) break;
    Using<VarIntFormatter<(VarIntMode)0>,unsigned_long&>((unsigned_long *)in_stack_fffffffffffffe60)
    ;
    SpanReader::operator>>
              ((SpanReader *)in_stack_fffffffffffffe68,
               (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)in_stack_fffffffffffffe60
              );
    in_stack_ffffffffffffff08 =
         anon_unknown.dwarf_313425::DepGraphFormatter::UnsignedToSigned
                   ((uint64_t)in_stack_fffffffffffffe60);
    puVar6 = local_18;
    FeeFrac::FeeFrac(in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe5c);
    in_stack_ffffffffffffff04 =
         cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddTransaction
                   (in_stack_fffffffffffffe88,(FeeFrac *)in_stack_fffffffffffffe80.m_object);
    pDVar7 = local_48;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (value_type_conflict5 *)0x4fae88);
    local_78 = 0;
    in_stack_fffffffffffffe88 = in_RSI;
    Using<VarIntFormatter<(VarIntMode)0>,unsigned_long&>((unsigned_long *)in_stack_fffffffffffffe60)
    ;
    SpanReader::operator>>
              ((SpanReader *)in_stack_fffffffffffffe68,
               (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)in_stack_fffffffffffffe60
              );
    for (in_stack_ffffffffffffff00 = 0; in_stack_ffffffffffffff00 < in_stack_ffffffffffffff04;
        in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + 1) {
      cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Descendants
                ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)in_stack_fffffffffffffe68,
                 (ClusterIndex)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      bVar1 = bitset_detail::IntBitSet<unsigned_int>::operator[]
                        ((IntBitSet<unsigned_int> *)in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe5c);
      if (!bVar1) {
        if (local_78 == 0) {
          cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddDependency
                    (pDVar7,(ClusterIndex)((ulong)puVar6 >> 0x20),(ClusterIndex)puVar6);
          in_stack_fffffffffffffe80 =
               Using<VarIntFormatter<(VarIntMode)0>,unsigned_long&>
                         ((unsigned_long *)in_stack_fffffffffffffe60);
          SpanReader::operator>>
                    ((SpanReader *)in_stack_fffffffffffffe68,
                     (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)
                     in_stack_fffffffffffffe60);
        }
        else {
          local_78 = local_78 - 1;
        }
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe60);
    while (bVar1 = __gnu_cxx::
                   operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_fffffffffffffe68,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_fffffffffffffe60), ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      in_stack_fffffffffffffe68 = (FeeFrac *)(ulong)*puVar4;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *puVar4 = (uint)((FeeFrac *)(sVar5 - (local_78 % (sVar3 + 1) & 0xffffffff)) <=
                      in_stack_fffffffffffffe68) + *puVar4;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    in_stack_fffffffffffffe60 = local_48;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (value_type_conflict5 *)0x4fb10b);
  }
  Span<unsigned_int_const>::Span<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Span<const_unsigned_int> *)in_stack_fffffffffffffe68,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe60,
             (type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  mapping.m_data._4_4_ = in_stack_ffffffffffffff04;
  mapping.m_data._0_4_ = in_stack_ffffffffffffff00;
  mapping.m_size = in_stack_ffffffffffffff08;
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)this_00.m_object,pDVar7,mapping);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::operator=
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::~DepGraph
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe68);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::~DepGraph
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unser(Stream& s, DepGraph<SetType>& depgraph)
    {
        /** The dependency graph which we deserialize into first, with transactions in
         *  topological serialization order, not original cluster order. */
        DepGraph<SetType> topo_depgraph;
        /** Mapping from serialization order to cluster order, used later to reconstruct the
         *  cluster order. */
        std::vector<ClusterIndex> reordering;

        // Read transactions in topological order.
        try {
            while (true) {
                // Read size. Size 0 signifies the end of the DepGraph.
                int32_t size;
                s >> VARINT_MODE(size, VarIntMode::NONNEGATIVE_SIGNED);
                size &= 0x3FFFFF; // Enough for size up to 4M.
                static_assert(0x3FFFFF >= 4000000);
                if (size == 0 || topo_depgraph.TxCount() == SetType::Size()) break;
                // Read fee, encoded as an unsigned varint (odd=negative, even=non-negative).
                uint64_t coded_fee;
                s >> VARINT(coded_fee);
                coded_fee &= 0xFFFFFFFFFFFFF; // Enough for fee between -21M...21M BTC.
                static_assert(0xFFFFFFFFFFFFF > uint64_t{2} * 21000000 * 100000000);
                auto fee = UnsignedToSigned(coded_fee);
                // Extend topo_depgraph with the new transaction (preliminarily at the end).
                auto topo_idx = topo_depgraph.AddTransaction({fee, size});
                reordering.push_back(reordering.size());
                // Read dependency information.
                uint64_t diff = 0; //!< How many potential parents we have to skip.
                s >> VARINT(diff);
                for (ClusterIndex dep_dist = 0; dep_dist < topo_idx; ++dep_dist) {
                    /** Which topo_depgraph index we are currently considering as parent of topo_idx. */
                    ClusterIndex dep_topo_idx = topo_idx - 1 - dep_dist;
                    // Ignore transactions which are already known ancestors of topo_idx.
                    if (topo_depgraph.Descendants(dep_topo_idx)[topo_idx]) continue;
                    if (diff == 0) {
                        // When the skip counter has reached 0, add an actual dependency.
                        topo_depgraph.AddDependency(dep_topo_idx, topo_idx);
                        // And read the number of skips after it.
                        s >> VARINT(diff);
                    } else {
                        // Otherwise, dep_topo_idx is not a parent. Decrement and continue.
                        --diff;
                    }
                }
                // If we reach this point, we can interpret the remaining skip value as how far
                // from the end of reordering the new transaction should be placed (wrapping
                // around), so remove the preliminary position it was put in above (which was to
                // make sure that if a deserialization exception occurs, the new transaction still
                // has some entry in reordering).
                reordering.pop_back();
                ClusterIndex insert_distance = diff % (reordering.size() + 1);
                // And then update reordering to reflect this new transaction's insertion.
                for (auto& pos : reordering) {
                    pos += (pos >= reordering.size() - insert_distance);
                }
                reordering.push_back(reordering.size() - insert_distance);
            }
        } catch (const std::ios_base::failure&) {}

        // Construct the original cluster order depgraph.
        depgraph = DepGraph(topo_depgraph, reordering);
    }